

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

bool __thiscall
nlohmann::json_abi_v3_11_3::detail::
lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<std::istreambuf_iterator<char,_std::char_traits<char>_>_>_>
::scan_comment(lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<std::istreambuf_iterator<char,_std::char_traits<char>_>_>_>
               *this)

{
  bool bVar1;
  char_int_type cVar2;
  char *pcVar3;
  
  cVar2 = get(this);
  if (cVar2 == 0x2f) {
    do {
      do {
        cVar2 = get(this);
      } while (0xe < cVar2 + 1U);
    } while ((0x4803U >> (cVar2 + 1U & 0x1f) & 1) == 0);
LAB_001575af:
    bVar1 = true;
  }
  else {
    if (cVar2 == 0x2a) {
      do {
        while (cVar2 = get(this), cVar2 == 0x2a) {
          cVar2 = get(this);
          if (cVar2 == 0x2f) goto LAB_001575af;
          unget(this);
        }
      } while (1 < cVar2 + 1U);
      pcVar3 = "invalid comment; missing closing \'*/\'";
    }
    else {
      pcVar3 = "invalid comment; expecting \'/\' or \'*\' after \'/\'";
    }
    this->error_message = pcVar3;
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool scan_comment()
    {
        switch (get())
        {
            // single-line comments skip input until a newline or EOF is read
            case '/':
            {
                while (true)
                {
                    switch (get())
                    {
                        case '\n':
                        case '\r':
                        case char_traits<char_type>::eof():
                        case '\0':
                            return true;

                        default:
                            break;
                    }
                }
            }

            // multi-line comments skip input until */ is read
            case '*':
            {
                while (true)
                {
                    switch (get())
                    {
                        case char_traits<char_type>::eof():
                        case '\0':
                        {
                            error_message = "invalid comment; missing closing '*/'";
                            return false;
                        }

                        case '*':
                        {
                            switch (get())
                            {
                                case '/':
                                    return true;

                                default:
                                {
                                    unget();
                                    continue;
                                }
                            }
                        }

                        default:
                            continue;
                    }
                }
            }

            // unexpected character after reading '/'
            default:
            {
                error_message = "invalid comment; expecting '/' or '*' after '/'";
                return false;
            }
        }
    }